

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O0

_Bool effect_handler_BIZARRE(effect_handler_context_t_conflict *context)

{
  _Bool _Var1;
  uint32_t uVar2;
  source sVar3;
  source sVar4;
  source origin;
  loc_conflict local_44;
  loc_conflict target_1;
  wchar_t flg_1;
  loc_conflict local_24;
  loc_conflict target;
  wchar_t flg;
  effect_handler_context_t_conflict *context_local;
  
  context->ident = true;
  unique0x100002cf = context;
  uVar2 = Rand_div(10);
  switch(uVar2) {
  case 0:
  case 1:
    msg("You are surrounded by a malignant aura.");
    player_stat_dec(player,L'\0',true);
    player_stat_dec(player,L'\x01',true);
    player_stat_dec(player,L'\x02',true);
    player_stat_dec(player,L'\x03',true);
    player_stat_dec(player,L'\x04',true);
    player_exp_lose(player,player->exp / 4,true);
    context_local._7_1_ = true;
    break;
  case 2:
    msg("You are surrounded by a powerful aura.");
    origin._4_4_ = 0;
    origin.what = (stack0xffffffffffffffe8->origin).what;
    origin.which.trap = (stack0xffffffffffffffe8->origin).which.trap;
    effect_simple(L'3',origin,"1000",L'/',L'\0',L'\0',L'\0',L'\0',(_Bool *)0x0);
    context_local._7_1_ = true;
    break;
  case 3:
  case 4:
  case 5:
    target.x = L'|';
    local_24 = (loc_conflict)loc_sum(player->grid,ddgrid[stack0xffffffffffffffe8->dir]);
    if ((stack0xffffffffffffffe8->dir == 5) && (_Var1 = target_okay(), _Var1)) {
      target.x = target.x & 0xfffffff3;
      target_get((loc *)&local_24);
    }
    sVar3 = source_player();
    target_1.y = sVar3.what;
    sVar4._4_4_ = 0;
    sVar4.what = target_1.y;
    sVar4.which.trap = sVar3.which.trap;
    context_local._7_1_ =
         project(sVar4,L'\x03',local_24,L'Ĭ',L'\x19',target.x,L'\0','\0',
                 stack0xffffffffffffffe8->obj);
    break;
  case 6:
  case 7:
  case 8:
  case 9:
    target_1.x = L'L';
    local_44 = (loc_conflict)loc_sum(player->grid,ddgrid[stack0xffffffffffffffe8->dir]);
    if ((stack0xffffffffffffffe8->dir == 5) && (_Var1 = target_okay(), _Var1)) {
      target_get((loc *)&local_44);
    }
    sVar4 = source_player();
    sVar3._4_4_ = 0;
    sVar3.what = sVar4.what;
    sVar3.which.trap = sVar4.which.trap;
    context_local._7_1_ =
         project(sVar3,L'\0',local_44,L'ú',L'\x19',target_1.x,L'\0','\0',
                 stack0xffffffffffffffe8->obj);
    break;
  default:
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_BIZARRE(effect_handler_context_t *context)
{
	context->ident = true;

	/* Pick a random effect */
	switch (randint1(10))
	{
		case 1:
		case 2:
		{
			/* Message */
			msg("You are surrounded by a malignant aura.");

			/* Decrease all stats (permanently) */
			player_stat_dec(player, STAT_STR, true);
			player_stat_dec(player, STAT_INT, true);
			player_stat_dec(player, STAT_WIS, true);
			player_stat_dec(player, STAT_DEX, true);
			player_stat_dec(player, STAT_CON, true);

			/* Lose some experience (permanently) */
			player_exp_lose(player, player->exp / 4, true);

			return true;
		}

		case 3:
		{
			/* Message */
			msg("You are surrounded by a powerful aura.");

			/* Dispel monsters */
			effect_simple(EF_PROJECT_LOS, context->origin, "1000", PROJ_DISP_ALL, 0, 0, 0, 0, NULL);

			return true;
		}

		case 4:
		case 5:
		case 6:
		{
			/* Mana Ball */
			int flg = PROJECT_THRU | PROJECT_STOP | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;
			struct loc target = loc_sum(player->grid, ddgrid[context->dir]);

			/* Ask for a target if no direction given */
			if ((context->dir == DIR_TARGET) && target_okay()) {
				flg &= ~(PROJECT_STOP | PROJECT_THRU);

				target_get(&target);
			}

			/* Aim at the target, explode */
			return (project(source_player(), 3, target, 300, PROJ_MANA, flg, 0,
							0, context->obj));
		}

		case 7:
		case 8:
		case 9:
		case 10:
		{
			/* Mana Bolt */
			int flg = PROJECT_STOP | PROJECT_KILL | PROJECT_THRU;
			struct loc target = loc_sum(player->grid, ddgrid[context->dir]);

			/* Use an actual target */
			if ((context->dir == DIR_TARGET) && target_okay())
				target_get(&target);

			/* Aim at the target, do NOT explode */
			return project(source_player(), 0, target, 250, PROJ_MANA, flg, 0,
						   0, context->obj);
		}
	}

	return false;
}